

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rvm.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t *psVar1;
  char *pcVar2;
  int *piVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  undefined4 *puVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  Extractor ex;
  Mat local_538;
  float norm_vals2 [3];
  float mean_vals2 [3];
  float norm_vals1 [3];
  float mean_vals1 [3];
  Mat local_4a8;
  Mat cv_fgr;
  int local_450;
  uint uStack_44c;
  long local_448;
  long *local_410;
  Mat cv_pha;
  long local_3e8 [7];
  long *local_3b0;
  Net net;
  undefined1 local_338 [32];
  Allocator *local_318;
  int iStack_310;
  int iStack_30c;
  undefined8 uStack_308;
  int local_300;
  size_t local_2f8;
  undefined1 local_2e8 [32];
  Allocator *local_2c8;
  int iStack_2c0;
  uint uStack_2bc;
  int local_2b8;
  undefined8 uStack_2b4;
  size_t local_2a8;
  undefined1 local_298 [32];
  Allocator *local_278;
  int iStack_270;
  int iStack_26c;
  undefined8 uStack_268;
  int local_260;
  size_t local_258;
  Mat m;
  int local_240;
  int local_23c;
  uchar *local_238;
  undefined1 local_1e8 [32];
  Allocator *local_1c8;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  undefined8 uStack_1b4;
  size_t local_1a8;
  Mat local_198;
  Mat local_150;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat pha;
  undefined8 *local_b0;
  Mat fgr;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&cv_pha,pcVar2,(allocator *)&cv_fgr);
    cv::imread((string *)&m,(int)&cv_pha);
    if (_cv_pha != local_3e8) {
      operator_delete(_cv_pha);
    }
    cVar4 = cv::Mat::empty();
    if (cVar4 == '\0') {
      cv::Mat::Mat(&fgr);
      cv::Mat::Mat(&pha);
      ncnn::Net::Net(&net);
      net.opt.use_vulkan_compute = false;
      ncnn::Net::load_param(&net,"rvm_512.param");
      ncnn::Net::load_model(&net,"rvm_512.bin");
      local_538.cstep = 0;
      local_538.data._0_4_ = 0;
      local_538.data._4_4_ = 0;
      local_538.refcount._0_4_ = 0;
      local_538.refcount._4_4_ = 0;
      local_538.elemsize._0_4_ = 0;
      local_538.elemsize._4_1_ = false;
      local_538.elemsize._5_1_ = false;
      local_538.elemsize._6_1_ = false;
      local_538.elemsize._7_1_ = false;
      local_538.elempack = 0;
      local_538.allocator = (Allocator *)0x0;
      local_538.dims = 0;
      local_538.w = 0;
      local_538.h = 0;
      local_538.d = 0;
      local_538.c = 0;
      ncnn::Mat::create(&local_538,0x80,0x80,0x10,4,(Allocator *)0x0);
      local_4a8.cstep = 0;
      local_4a8.data._0_4_ = 0;
      local_4a8.data._4_4_ = 0;
      local_4a8.refcount._0_4_ = 0;
      local_4a8.refcount._4_4_ = 0;
      local_4a8.elemsize = 0;
      local_4a8.elempack = 0;
      local_4a8.allocator = (Allocator *)0x0;
      local_4a8.dims = 0;
      local_4a8.w = 0;
      local_4a8.h = 0;
      local_4a8.d = 0;
      local_4a8.c = 0;
      ncnn::Mat::create(&local_4a8,0x40,0x40,0x14,4,(Allocator *)0x0);
      local_2f8 = 0;
      local_338._0_8_ = (void *)0x0;
      local_338._8_4_ = 0;
      local_338._12_4_ = 0;
      local_338._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_318 = (Allocator *)0x0;
      iStack_310 = 0;
      iStack_30c = 0;
      uStack_308._0_4_ = 0;
      uStack_308._4_4_ = 0;
      local_300 = 0;
      ncnn::Mat::create((Mat *)local_338,0x20,0x20,0x28,4,(Allocator *)0x0);
      local_258 = 0;
      local_298._0_8_ = (void *)0x0;
      local_298._8_4_ = 0;
      local_298._12_4_ = 0;
      local_298._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_278 = (Allocator *)0x0;
      iStack_270 = 0;
      iStack_26c = 0;
      uStack_268._0_4_ = 0;
      uStack_268._4_4_ = 0;
      local_260 = 0;
      ncnn::Mat::create((Mat *)local_298,0x10,0x10,0x40,4,(Allocator *)0x0);
      if (0 < local_538.c * (int)local_538.cstep) {
        memset((void *)CONCAT44(local_538.data._4_4_,local_538.data._0_4_),0,
               (ulong)(uint)(local_538.c * (int)local_538.cstep) << 2);
      }
      if (0 < local_4a8.c * (int)local_4a8.cstep) {
        memset((void *)CONCAT44(local_4a8.data._4_4_,local_4a8.data._0_4_),0,
               (ulong)(uint)(local_4a8.c * (int)local_4a8.cstep) << 2);
      }
      if (0 < local_300 * (int)local_2f8) {
        memset((void *)local_338._0_8_,0,(ulong)(uint)(local_300 * (int)local_2f8) << 2);
      }
      if (0 < local_260 * (int)local_258) {
        memset((void *)local_298._0_8_,0,(ulong)(uint)(local_260 * (int)local_258) << 2);
      }
      ncnn::Net::create_extractor((Net *)&ex);
      mean_vals1[0] = 123.675;
      mean_vals1[1] = 116.28;
      mean_vals1[2] = 103.53;
      norm_vals1[0] = 0.01712475;
      norm_vals1[1] = 0.0175;
      norm_vals1[2] = 0.01742919;
      mean_vals2[0] = 0.0;
      mean_vals2[1] = 0.0;
      mean_vals2[2] = 0.0;
      norm_vals2[0] = 0.003921569;
      norm_vals2[1] = 0.003921569;
      norm_vals2[2] = 0.003921569;
      ncnn::Mat::from_pixels_resize
                (&local_150,local_238,0x10002,local_23c,local_240,0x200,0x200,(Allocator *)0x0);
      ncnn::Mat::from_pixels_resize
                (&local_198,local_238,0x10002,local_23c,local_240,0x100,0x100,(Allocator *)0x0);
      ncnn::Mat::substract_mean_normalize(&local_198,mean_vals1,norm_vals1);
      ncnn::Mat::substract_mean_normalize(&local_150,mean_vals2,norm_vals2);
      ncnn::Extractor::input(&ex,"src1",&local_198);
      ncnn::Extractor::input(&ex,"src2",&local_150);
      ncnn::Extractor::input(&ex,"r1i",&local_538);
      ncnn::Extractor::input(&ex,"r2i",&local_4a8);
      ncnn::Extractor::input(&ex,"r3i",(Mat *)local_338);
      ncnn::Extractor::input(&ex,"r4i",(Mat *)local_298);
      ncnn::Extractor::extract(&ex,"r4o",(Mat *)local_298,0);
      ncnn::Extractor::extract(&ex,"r3o",(Mat *)local_338,0);
      ncnn::Extractor::extract(&ex,"r2o",&local_4a8,0);
      ncnn::Extractor::extract(&ex,"r1o",&local_538,0);
      local_1a8 = 0;
      local_1e8._0_8_ = (void *)0x0;
      local_1e8._8_4_ = 0;
      local_1e8._12_4_ = 0;
      local_1e8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_1c8 = (Allocator *)0x0;
      iStack_1c0 = 0;
      iStack_1bc = 0;
      local_1b8 = 0;
      uStack_1b4._0_4_ = 0;
      uStack_1b4._4_4_ = 0;
      ncnn::Extractor::extract(&ex,"pha",(Mat *)local_1e8,0);
      local_2a8 = 0;
      local_2e8._0_8_ = (void *)0x0;
      local_2e8._8_4_ = 0;
      local_2e8._12_4_ = 0;
      local_2e8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2c8 = (Allocator *)0x0;
      iStack_2c0 = 0;
      uStack_2bc = 0;
      local_2b8 = 0;
      uStack_2b4._0_4_ = 0;
      uStack_2b4._4_4_ = 0;
      ncnn::Extractor::extract(&ex,"fgr",(Mat *)local_2e8,0);
      cv::Mat::Mat(&cv_pha,local_1b8,iStack_1bc,5,(void *)local_1e8._0_8_,0);
      cv::Mat::Mat(&cv_fgr,local_2b8,uStack_2bc,0x15);
      if (0 < (long)local_2b8) {
        iVar8 = local_2b8 * uStack_2bc;
        iVar9 = iVar8 * 2;
        lVar10 = 0;
        pvVar11 = (void *)local_2e8._0_8_;
        do {
          if (0 < (int)uStack_2bc) {
            puVar7 = (undefined4 *)(*local_410 * lVar10 + local_448 + 8);
            uVar12 = 0;
            do {
              *puVar7 = *(undefined4 *)((long)pvVar11 + uVar12 * 4);
              puVar7[-1] = *(undefined4 *)(local_2e8._0_8_ + uVar12 * 4 + (long)iVar8 * 4);
              puVar7[-2] = *(undefined4 *)(local_2e8._0_8_ + uVar12 * 4 + (long)iVar9 * 4);
              uVar12 = uVar12 + 1;
              puVar7 = puVar7 + 3;
            } while (uStack_2bc != uVar12);
          }
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + uStack_2bc;
          iVar8 = iVar8 + uStack_2bc;
          pvVar11 = (void *)((long)pvVar11 + (long)(int)uStack_2bc * 4);
        } while (lVar10 != local_2b8);
      }
      local_f8 = 0;
      local_108 = 0x2010000;
      local_100 = &pha;
      cv::Mat::copyTo((_OutputArray *)&cv_pha);
      local_f8 = 0;
      local_108 = 0x2010000;
      local_100 = &fgr;
      cv::Mat::copyTo((_OutputArray *)&cv_fgr);
      cv::Mat::~Mat(&cv_fgr);
      cv::Mat::~Mat(&cv_pha);
      piVar3 = (int *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_2c8 == (Allocator *)0x0) {
            if ((void *)local_2e8._0_8_ != (void *)0x0) {
              free((void *)local_2e8._0_8_);
            }
          }
          else {
            (*local_2c8->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_1c8 == (Allocator *)0x0) {
            if ((void *)local_1e8._0_8_ != (void *)0x0) {
              free((void *)local_1e8._0_8_);
            }
          }
          else {
            (*local_1c8->_vptr_Allocator[3])();
          }
        }
      }
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_150.refcount != (int *)0x0) {
        LOCK();
        *local_150.refcount = *local_150.refcount + -1;
        UNLOCK();
        if (*local_150.refcount == 0) {
          if (local_150.allocator == (Allocator *)0x0) {
            if (local_150.data != (void *)0x0) {
              free(local_150.data);
            }
          }
          else {
            (*(local_150.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar3 = (int *)CONCAT44(local_298._12_4_,local_298._8_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_278 == (Allocator *)0x0) {
            if ((void *)local_298._0_8_ != (void *)0x0) {
              free((void *)local_298._0_8_);
            }
          }
          else {
            (*local_278->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_338._12_4_,local_338._8_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_318 == (Allocator *)0x0) {
            if ((void *)local_338._0_8_ != (void *)0x0) {
              free((void *)local_338._0_8_);
            }
          }
          else {
            (*local_318->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_4a8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_4a8.data._4_4_,local_4a8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_4a8.data._4_4_,local_4a8.data._0_4_));
            }
          }
          else {
            (*(local_4a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_538.refcount._4_4_,local_538.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_538.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_538.data._4_4_,local_538.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_538.data._4_4_,local_538.data._0_4_));
            }
          }
          else {
            (*(local_538.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&net);
      cv::Mat::Mat(&cv_pha);
      _cv_fgr = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&fgr,(int)&cv_fgr,255.0,0.0);
      cv::Mat::Mat(&cv_fgr);
      net.opt.blob_allocator = (Allocator *)0x0;
      net._vptr_Net._0_4_ = 0x2010000;
      net.opt._0_8_ = &cv_fgr;
      cv::Mat::convertTo((_OutputArray *)&pha,(int)&net,255.0,0.0);
      cv::Mat::Mat((Mat *)&net);
      local_538.elemsize._0_4_ = 0;
      local_538.elemsize._4_4_ = 0;
      local_538.data._0_4_ = 0x1010000;
      local_538.refcount = (int *)&m;
      local_4a8.elemsize = 0;
      local_4a8.data._0_4_ = 0x2010000;
      local_338._0_8_ = CONCAT44((int)*local_b0,(int)((ulong)*local_b0 >> 0x20));
      local_4a8.refcount = (int *)&net;
      cv::resize(0,0);
      local_450 = (int)&cv_pha;
      uStack_44c = (uint)((ulong)&cv_pha >> 0x20);
      if (0 < local_450) {
        uVar12 = (ulong)uStack_44c;
        lVar10 = 0;
        do {
          if (0 < (int)uVar12) {
            lVar5 = 2;
            lVar6 = 0;
            do {
              fVar13 = (float)*(byte *)(lVar6 + *local_410 * lVar10) / 255.0;
              fVar14 = 1.0 - fVar13;
              *(char *)((long)net.opt.blob_allocator + lVar5 + -2 + (long)(net.d)->opt * lVar10) =
                   (char)(int)((float)*(byte *)(lVar5 + -2 + *local_3b0 * lVar10 + local_3e8[0]) *
                               fVar13 + fVar14 * 155.0);
              *(char *)((long)net.opt.blob_allocator + lVar5 + -1 + (long)(net.d)->opt * lVar10) =
                   (char)(int)((float)*(byte *)(lVar5 + -1 + *local_3b0 * lVar10 + local_3e8[0]) *
                               fVar13 + fVar14 * 255.0);
              *(char *)((long)&(net.opt.blob_allocator)->_vptr_Allocator +
                       lVar5 + (long)(net.d)->opt * lVar10) =
                   (char)(int)((float)*(byte *)(lVar5 + *local_3b0 * lVar10 + local_3e8[0]) * fVar13
                              + fVar14 * 120.0);
              lVar6 = lVar6 + 1;
              uVar12 = (ulong)(int)uStack_44c;
              lVar5 = lVar5 + 3;
            } while (lVar6 < (long)uVar12);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < local_450);
      }
      psVar1 = &local_538.elemsize;
      local_538.elemsize._0_4_ = 0x616870;
      local_538.refcount._0_4_ = 3;
      local_538.refcount._4_4_ = 0;
      local_4a8.elemsize = 0;
      local_4a8.data._0_4_ = 0x1010000;
      local_4a8.refcount = (int *)&cv_fgr;
      local_538.data = psVar1;
      cv::imshow((string *)&local_538,(_InputArray *)&local_4a8);
      if ((size_t *)local_538.data != psVar1) {
        operator_delete(local_538.data);
      }
      local_538.elemsize._0_4_ = 0x726766;
      local_538.refcount._0_4_ = 3;
      local_538.refcount._4_4_ = 0;
      local_4a8.elemsize = 0;
      local_4a8.data._0_4_ = 0x1010000;
      local_4a8.refcount = (int *)&cv_pha;
      local_538.data = psVar1;
      cv::imshow((string *)&local_538,(_InputArray *)&local_4a8);
      if ((size_t *)local_538.data != psVar1) {
        operator_delete(local_538.data);
      }
      local_538.elemsize._0_4_ = 0x706d6f63;
      local_538.refcount._0_4_ = 4;
      local_538.refcount._4_4_ = 0;
      local_538.elemsize._4_4_ = local_538.elemsize._4_4_ & 0xffffff00;
      local_4a8.elemsize = 0;
      local_4a8.data._0_4_ = 0x1010000;
      local_4a8.refcount = (int *)&net;
      local_538.data = psVar1;
      cv::imshow((string *)&local_538,(_InputArray *)&local_4a8);
      if ((size_t *)local_538.data != psVar1) {
        operator_delete(local_538.data);
      }
      iVar9 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&net);
      cv::Mat::~Mat(&cv_fgr);
      cv::Mat::~Mat(&cv_pha);
      cv::Mat::~Mat(&pha);
      cv::Mat::~Mat(&fgr);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar9 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    cv::Mat fgr, pha;
    detect_rvm(m, pha, fgr);
    draw_objects(m, fgr, pha);

    return 0;
}